

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_SetUnlockingScript_bytedata_Test::TestBody
          (AbstractTransaction_SetUnlockingScript_bytedata_Test *this)

{
  bool bVar1;
  char *message;
  allocator local_161;
  Script local_160;
  AssertionResult gtest_ar;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> bytedatas;
  string local_f8;
  AbstractTxInReference local_d8;
  Transaction tx;
  
  cfd::core::Transaction::Transaction(&tx,2,3);
  std::__cxx11::string::string
            ((string *)&local_f8,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             (allocator *)&gtest_ar);
  cfd::core::Txid::Txid((Txid *)&local_160,&local_f8);
  std::__cxx11::string::string
            ((string *)&bytedatas,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",&local_161);
  cfd::core::Script::Script((Script *)&local_d8,(string *)&bytedatas);
  cfd::core::Transaction::AddTxIn(&tx,(Txid *)&local_160,0,0xffffffff,(Script *)&local_d8);
  cfd::core::Script::~Script((Script *)&local_d8);
  std::__cxx11::string::~string((string *)&bytedatas);
  cfd::core::Txid::~Txid((Txid *)&local_160);
  std::__cxx11::string::~string((string *)&local_f8);
  bytedatas.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bytedatas.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bytedatas.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Transaction::SetUnlockingScript(&tx,3,&bytedatas);
  }
  testing::Message::Message((Message *)&local_d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_160,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xb0,
             "Expected: tx.SetUnlockingScript(3, bytedatas) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_d8);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763",
             (allocator *)&local_f8);
  cfd::core::ByteData::ByteData((ByteData *)&local_160,(string *)&local_d8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
  emplace_back<cfd::core::ByteData>(&bytedatas,(ByteData *)&local_160);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetUnlockingScript(&tx,0,&bytedatas);
    }
  }
  else {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb6,
               "Expected: tx.SetUnlockingScript(0, bytedatas) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_d8,&tx,0);
  cfd::core::Script::Script(&local_160,&local_d8.unlocking_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_f8,&local_160);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str()",
             "\"2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\"",
             local_f8._M_dataplus._M_p,
             "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  std::__cxx11::string::~string((string *)&local_f8);
  cfd::core::Script::~Script(&local_160);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb9,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&bytedatas);
  cfd::core::Transaction::~Transaction(&tx);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript_bytedata) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  std::vector<ByteData> bytedatas;
  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, bytedatas), CfdException);

  bytedatas.push_back(
      ByteData(
          "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"));

  EXPECT_NO_THROW(tx.SetUnlockingScript(0, bytedatas));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}